

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::MediaAccumulator::
try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
          (MediaAccumulator *this,IntType platforms,char *extension)

{
  int iVar1;
  uint uVar2;
  DiskImageHolder<Storage::Disk::SSD> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  shared_ptr<Storage::Disk::Disk> local_18;
  
  iVar1 = std::__cxx11::string::compare((char *)(this + 0x70));
  if (iVar1 == 0) {
    local_28 = (DiskImageHolder<Storage::Disk::SSD> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>,std::__cxx11::string_const&>
              (&local_20,&local_28,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>_> *)&local_18,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0x60))
    ;
    local_18.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_28;
    local_18.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_20._M_pi;
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)this,&local_18);
    if (local_18.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_18.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    **(uint **)(this + 0x68) = **(uint **)(this + 0x68) | 0x760;
    if (local_28 != (DiskImageHolder<Storage::Disk::SSD> *)0x0) {
      uVar2 = (**(local_28->super_TypeDistinguisher)._vptr_TypeDistinguisher)
                        (&local_28->super_TypeDistinguisher);
      **(uint **)(this + 0x68) = **(uint **)(this + 0x68) & uVar2;
    }
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    }
  }
  return;
}

Assistant:

void try_standard(TargetPlatform::IntType platforms, const char *extension) {
		if(name_matches(extension))	{
			try_insert<InstanceT>(platforms, file_name_);
		}
	}